

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<long_long,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,longlong *values,int rows,
               int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImPlotPlot *pIVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  longlong *plVar8;
  ImDrawList *this;
  long lVar9;
  ImU32 col;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ImVec4 IVar24;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_108;
  int local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  longlong *local_c0;
  char *local_b8;
  double local_b0;
  double local_a8;
  ImDrawList *local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  double local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ImVec2 local_60;
  ImVec4 local_58 [2];
  
  pIVar5 = GImPlot;
  dVar16 = (bounds_max->x - bounds_min->x) / (double)cols;
  dVar17 = (bounds_max->y - bounds_min->y) / (double)rows;
  dVar20 = dVar16 * 0.5;
  lVar10 = (long)transformer.YAxis;
  local_a8 = scale_max - scale_min;
  local_98 = (ulong)(uint)cols;
  local_c0 = values;
  local_b8 = fmt;
  local_b0 = scale_min;
  local_a0 = DrawList;
  local_90 = dVar16;
  if (0 < rows) {
    dVar21 = dVar17 * 0.5;
    uVar11 = 0;
    local_88 = dVar17 * 0.5;
    dVar23 = dVar16 * 0.5;
    local_70 = lVar10 << 7;
    local_68 = lVar10 * 0x10;
    dVar22 = 0.0;
    iVar13 = 0;
    local_f8._0_8_ = dVar21;
    do {
      plVar8 = local_c0;
      if (0 < cols) {
        dVar18 = dVar17 * dVar22 + local_88;
        dVar19 = 0.0;
        lVar14 = 0;
        local_fc = iVar13;
        local_80 = dVar22;
        local_78 = uVar11;
        do {
          pIVar6 = GImPlot;
          dVar16 = dVar19 * dVar16 + bounds_min->x + dVar23;
          dVar15 = bounds_max->y - dVar18;
          local_d8 = dVar19;
          local_e8._0_8_ = dVar16;
          dVar2 = log10((dVar16 - dVar20) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          lVar9 = local_70;
          dVar16 = pIVar6->LogDenX;
          pIVar1 = pIVar6->CurrentPlot;
          dVar22 = (pIVar1->XAxis).Range.Min;
          dVar19 = (pIVar1->XAxis).Range.Max;
          dVar3 = log10((dVar15 - dVar21) /
                        *(double *)((long)&pIVar1->YAxis[0].Range.Min + local_70));
          pIVar7 = GImPlot;
          pIVar1 = pIVar6->CurrentPlot;
          dVar21 = *(double *)((long)&pIVar1->YAxis[0].Range.Min + lVar9);
          local_108.y = (float)((((double)(float)(dVar3 / pIVar6->LogDenY[lVar10]) *
                                  (*(double *)((long)&pIVar1->YAxis[0].Range.Max + lVar9) - dVar21)
                                 + dVar21) - dVar21) * pIVar6->My[lVar10] +
                               (double)pIVar6->PixelRange[lVar10].Min.y);
          local_108.x = (float)((((double)(float)(dVar2 / dVar16) * (dVar19 - dVar22) + dVar22) -
                                (pIVar1->XAxis).Range.Min) * pIVar6->Mx +
                               (double)pIVar6->PixelRange[lVar10].Min.x);
          dVar15 = dVar15 + (double)local_f8._0_8_;
          dVar21 = log10(((double)local_e8._0_8_ + dVar20) / (GImPlot->CurrentPlot->XAxis).Range.Min
                        );
          pIVar1 = pIVar7->CurrentPlot;
          dVar16 = (pIVar1->XAxis).Range.Min;
          local_e8._0_8_ =
               (double)(float)(dVar21 / pIVar7->LogDenX) * ((pIVar1->XAxis).Range.Max - dVar16) +
               dVar16;
          dVar21 = log10(dVar15 / *(double *)((long)&pIVar1->YAxis[0].Range.Min + lVar9));
          this = local_a0;
          pIVar1 = pIVar7->CurrentPlot;
          dVar16 = *(double *)((long)&pIVar1->YAxis[0].Range.Min + lVar9);
          local_60.y = (float)((((double)(float)(dVar21 / pIVar7->LogDenY[lVar10]) *
                                 (*(double *)((long)&pIVar1->YAxis[0].Range.Max + lVar9) - dVar16) +
                                dVar16) - dVar16) * pIVar7->My[lVar10] +
                              (double)pIVar7->PixelRange[lVar10].Min.y);
          local_60.x = (float)(((double)local_e8._0_8_ - (pIVar1->XAxis).Range.Min) * pIVar7->Mx +
                              (double)pIVar7->PixelRange[lVar10].Min.x);
          IVar24 = LerpColormap((float)(((double)plVar8[(int)uVar11 + lVar14] - local_b0) / local_a8
                                       + 0.0));
          local_58[0].w = IVar24.w;
          local_58[0]._0_12_ = IVar24._0_12_;
          local_58[0].w = (pIVar5->Style).FillAlpha * local_58[0].w;
          col = ImGui::GetColorU32(local_58);
          ImDrawList::AddRectFilled(this,&local_108,&local_60,col,0.0,0xf);
          dVar19 = local_d8 + 1.0;
          lVar14 = lVar14 + 1;
          dVar16 = local_90;
          dVar21 = (double)local_f8._0_8_;
        } while ((int)local_98 != (int)lVar14);
        uVar11 = (ulong)(uint)((int)local_78 + (int)lVar14);
        dVar22 = local_80;
        iVar13 = local_fc;
      }
      dVar22 = dVar22 + 1.0;
      iVar13 = iVar13 + 1;
    } while (iVar13 != rows);
  }
  if (0 < rows && local_b8 != (char *)0x0) {
    iVar13 = 0;
    dVar23 = 0.0;
    iVar12 = 0;
    do {
      plVar8 = local_c0;
      if (0 < cols) {
        dVar21 = 0.0;
        lVar14 = 0;
        do {
          pIVar5 = GImPlot;
          local_f8._0_8_ = (bounds_min->y + 1.0) - (dVar17 * dVar23 + dVar17 * 0.5);
          dVar16 = log10((dVar21 * dVar16 + bounds_min->x + dVar20) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar1 = pIVar5->CurrentPlot;
          local_d8 = (pIVar1->XAxis).Range.Min;
          local_d8 = (double)(float)(dVar16 / pIVar5->LogDenX) *
                     ((pIVar1->XAxis).Range.Max - local_d8) + local_d8;
          dVar22 = log10((double)local_f8._0_8_ / pIVar1->YAxis[lVar10].Range.Min);
          pIVar1 = pIVar5->CurrentPlot;
          dVar16 = pIVar1->YAxis[lVar10].Range.Min;
          local_f8 = ZEXT416((uint)(float)((local_d8 - (pIVar1->XAxis).Range.Min) * pIVar5->Mx +
                                          (double)pIVar5->PixelRange[lVar10].Min.x));
          dVar16 = (((double)(float)(dVar22 / pIVar5->LogDenY[lVar10]) *
                     (pIVar1->YAxis[lVar10].Range.Max - dVar16) + dVar16) - dVar16) *
                   pIVar5->My[lVar10] + (double)pIVar5->PixelRange[lVar10].Min.y;
          local_d8 = (double)CONCAT44((int)((ulong)dVar16 >> 0x20),(float)dVar16);
          sprintf((char *)local_58,local_b8,plVar8[iVar13 + lVar14]);
          IVar4 = ImGui::CalcTextSize((char *)local_58,(char *)0x0,false,-1.0);
          local_e8._8_4_ = extraout_XMM0_Dc;
          local_e8._0_4_ = IVar4.x;
          local_e8._4_4_ = IVar4.y;
          local_e8._12_4_ = extraout_XMM0_Dd;
          IVar24 = LerpColormap((float)(((double)plVar8[iVar13 + lVar14] - local_b0) / local_a8 +
                                       0.0));
          local_108.x = (float)local_f8._0_4_ - (float)local_e8._0_4_ * 0.5;
          local_108.y = (float)local_d8 - (float)local_e8._4_4_ * 0.5;
          ImDrawList::AddText(local_a0,&local_108,
                              -(uint)(IVar24.z * 0.114 + IVar24.x * 0.299 + IVar24.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)local_58,(char *)0x0);
          dVar21 = dVar21 + 1.0;
          lVar14 = lVar14 + 1;
          dVar16 = local_90;
        } while ((int)local_98 != (int)lVar14);
        iVar13 = iVar13 + (int)lVar14;
      }
      dVar23 = dVar23 + 1.0;
      iVar12 = iVar12 + 1;
    } while (iVar12 != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}